

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O3

unsigned_long
Js::JavascriptArray::GetFromIndex<unsigned_long>
          (Var arg,unsigned_long length,ScriptContext *scriptContext,bool addWithLength)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int64 iVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  double dVar7;
  double dVar8;
  undefined4 uVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (((ulong)arg & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)arg & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)arg & 0xffff000000000000) != 0x1000000000000) {
      dVar7 = JavascriptConversion::ToInteger_Full(arg,scriptContext);
      goto LAB_00b91431;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  iVar4 = TaggedInt::ToInt64(arg);
  dVar7 = (double)iVar4;
LAB_00b91431:
  uVar11 = (undefined4)(length >> 0x20);
  if (0.0 <= dVar7) {
    auVar10._8_4_ = uVar11;
    auVar10._0_8_ = length;
    auVar10._12_4_ = 0x45300000;
    dVar8 = ((double)CONCAT44(0x43300000,(int)length) - 4503599627370496.0) +
            (auVar10._8_8_ - 1.9342813113834067e+25);
    if (dVar8 <= dVar7) {
      dVar7 = dVar8;
    }
    uVar5 = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
  }
  else if (addWithLength) {
    auVar9._8_4_ = uVar11;
    auVar9._0_8_ = length;
    auVar9._12_4_ = 0x45300000;
    uVar6 = (unsigned_long)
            (dVar7 + ((double)CONCAT44(0x43300000,(int)length) - 4503599627370496.0) +
                     (auVar9._8_8_ - 1.9342813113834067e+25));
    uVar5 = 0;
    if (0 < (long)uVar6) {
      uVar5 = uVar6;
    }
  }
  else {
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

static T GetFromIndex(Var arg, T length, ScriptContext *scriptContext, bool addWithLength = true)
        {
            T fromIndex = 0;

            double value = TaggedInt::Is(arg) ? (double)TaggedInt::ToInt64(arg) : JavascriptConversion::ToInteger(arg, scriptContext);

            if (value < 0)
            {
                fromIndex = addWithLength ? (T)max(0i64, (int64)(value + length)) : 0;
            }
            else
            {
                fromIndex = (T)min(value, (double)length);
            }
            return fromIndex;
        }